

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O1

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekf_f
          (AttitudeQuaternionEKF *this,VectorDynSize *x_k,VectorDynSize *u_k,
          VectorDynSize *xhat_k_plus_one)

{
  double dVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  undefined1 (*pauVar7) [16];
  char *pcVar8;
  PointerType ptr;
  PointerType ptr_1;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  RealScalar z;
  UnitQuaternion q;
  UnitQuaternion orientation;
  UnitQuaternion q_hat_plus;
  UnitQuaternion local_c8;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  UnitQuaternion local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  lVar3 = iDynTree::VectorDynSize::size();
  lVar4 = iDynTree::VectorDynSize::size();
  if (lVar3 == lVar4) {
    lVar3 = iDynTree::VectorDynSize::size();
    lVar4 = iDynTree::VectorDynSize::size();
    if (lVar3 == lVar4) {
      lVar3 = iDynTree::VectorDynSize::size();
      lVar4 = iDynTree::VectorDynSize::size();
      if (lVar3 == lVar4) {
        pdVar5 = (double *)iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        pdVar6 = (double *)iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        pauVar7 = (undefined1 (*) [16])iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        local_78.m_data[0] = *pdVar5;
        local_78.m_data[1] = pdVar5[1];
        local_78.m_data[2] = pdVar5[2];
        local_78.m_data[3] = pdVar5[3];
        dVar10 = (this->m_params_qekf).time_step_in_seconds;
        dVar13 = pdVar5[4] * dVar10;
        dVar14 = pdVar5[5] * dVar10;
        local_88 = pdVar5[7];
        dStack_80 = pdVar5[8];
        dVar10 = dVar10 * pdVar5[6];
        dVar1 = pdVar5[9];
        local_c8.m_data[1] = 0.0;
        local_c8.m_data[2] = 0.0;
        local_c8.m_data[3] = 0.0;
        local_c8.m_data[0] = 1.0;
        dVar9 = SQRT(dVar10 * dVar10 + dVar14 * dVar14 + dVar13 * dVar13);
        if ((dVar9 != 0.0) || (NAN(dVar9))) {
          uStack_a0 = 0;
          local_a8 = dVar10;
          local_98 = dVar13;
          dStack_90 = dVar14;
          dVar10 = cos(dVar9 * 0.5);
          local_c8.m_data[2] = sin(dVar9 * 0.5);
          local_c8.m_data[2] = local_c8.m_data[2] / dVar9;
          local_c8.m_data[3] = local_a8 * local_c8.m_data[2];
          local_c8.m_data[1] = local_98 * local_c8.m_data[2];
          local_c8.m_data[2] = dStack_90 * local_c8.m_data[2];
          local_c8.m_data[0] = dVar10;
        }
        composeQuaternion2((UnitQuaternion *)local_58,&local_78,&local_c8);
        *pauVar7 = local_58;
        dVar10 = local_48._8_8_ * local_48._8_8_ + local_58._8_8_ * local_58._8_8_ +
                 local_48._0_8_ * local_48._0_8_ + local_58._0_8_ * local_58._0_8_;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar10;
        auVar11 = sqrtpd(auVar11,auVar11);
        auVar12._0_8_ = auVar11._0_8_;
        dVar9 = ABS(auVar12._0_8_);
        pauVar7[1] = local_48;
        bVar2 = dVar9 * 2.220446049250313e-16 * 4.0 < dVar9;
        if (bVar2) {
          dVar13 = 1.0;
          if (1.0 <= dVar9) {
            dVar13 = dVar9;
          }
          if ((dVar13 * 2.220446049250313e-16 * 4.0 < ABS(auVar12._0_8_ + -1.0)) && (0.0 < dVar10))
          {
            auVar12._8_8_ = auVar12._0_8_;
            auVar11 = divpd(local_58,auVar12);
            *pauVar7 = auVar11;
            auVar11 = divpd(local_48,auVar12);
            pauVar7[1] = auVar11;
          }
          dVar10 = pdVar6[1];
          *(double *)pauVar7[2] = *pdVar6 - local_88;
          *(double *)(pauVar7[2] + 8) = dVar10 - dStack_80;
          *(double *)pauVar7[3] = pdVar6[2] - dVar1;
          dVar10 = 1.0 - (this->m_params_qekf).bias_correlation_time_factor *
                         (this->m_params_qekf).time_step_in_seconds;
          *(double *)(pauVar7[3] + 8) = dVar10 * local_88;
          *(double *)pauVar7[4] = dVar10 * dStack_80;
          *(double *)(pauVar7[4] + 8) = dVar1 * dVar10;
          return bVar2;
        }
        iDynTree::reportError("AttitudeQuaternionEKF","ekf_f","invalid quaternion");
        return bVar2;
      }
      pcVar8 = "input size mismatch";
      goto LAB_00161f78;
    }
  }
  pcVar8 = "state size mismatch";
LAB_00161f78:
  iDynTree::reportError("AttitudeQuaternionEKF","ekf_f",pcVar8);
  return false;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekf_f(const iDynTree::VectorDynSize& x_k, const iDynTree::VectorDynSize& u_k, iDynTree::VectorDynSize& xhat_k_plus_one)
{
    if (x_k.size() != m_x.size() || xhat_k_plus_one.size() != m_x.size())
    {
        reportError("AttitudeQuaternionEKF", "ekf_f", "state size mismatch");
        return false;
    }

    if (u_k.size() != m_u.size())
    {
        reportError("AttitudeQuaternionEKF", "ekf_f", "input size mismatch");
        return false;
    }

    iDynTree::UnitQuaternion orientation;
    iDynTree::Vector3 ang_vel, gyro_bias;

    using iDynTree::toEigen;
    auto q(toEigen(orientation));
    auto Omega(toEigen(ang_vel));
    auto b(toEigen(gyro_bias));
    auto x(toEigen(x_k));
    auto u(toEigen(u_k));
    auto x_hat_plus(toEigen(xhat_k_plus_one));

    q = x.block<4,1>(0, 0);
    Omega = x.block<3,1>(4, 0)*m_params_qekf.time_step_in_seconds;
    b = x.block<3,1>(7, 0);

    iDynTree::UnitQuaternion correction = expQuaternion(ang_vel);
    iDynTree::UnitQuaternion q_hat_plus = composeQuaternion2(orientation, correction);

    x_hat_plus.block<4,1>(0, 0) = toEigen(q_hat_plus);
    double quat_norm = x_hat_plus.block<4,1>(0, 0).norm();

    double malformed_unit_quaternion_norm{0.0};
    if (check_are_almost_equal(quat_norm, malformed_unit_quaternion_norm, 4))
    {
        reportError("AttitudeQuaternionEKF", "ekf_f", "invalid quaternion");
        return false;
    }

    double unit_quaternion_norm{1.0};
    if (!check_are_almost_equal(quat_norm, unit_quaternion_norm, 4))
    {
        x_hat_plus.block<4,1>(0, 0).normalize();
    }
    x_hat_plus.block<3,1>(4, 0) = u - b;
    x_hat_plus.block<3,1>(7, 0) = b*(1 - (m_params_qekf.bias_correlation_time_factor*m_params_qekf.time_step_in_seconds));

    return true;
}